

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O2

void __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::insert
          (bt_impl<4096UL,_(bv::allocation_policy_t)0> *this,subtree_ref t,size_t index,bool bit)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  subtree_const_ref t_00;
  subtree_ref t_01;
  subtree_ref t_02;
  bool bVar3;
  size_t sVar4;
  leaf_reference this_00;
  long lVar5;
  EVP_PKEY_CTX *src;
  size_t k;
  pair<unsigned_long,_unsigned_long> pVar6;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *pbVar7;
  size_t sVar8;
  size_t local_138;
  size_t end;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *local_128;
  size_t count;
  size_t begin;
  range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  local_110;
  subtree_ref old_root;
  
  bVar3 = subtree_ref_base<false>::is_full(&t.super_subtree_ref_base<false>);
  if (bVar3) {
    subtree_ref::copy(&old_root,(EVP_PKEY_CTX *)&t.super_subtree_ref_base<false>,src);
    local_110._v = &(t.super_subtree_ref_base<false>._vector)->sizes;
    local_110._begin =
         t.super_subtree_ref_base<false>._index * (t.super_subtree_ref_base<false>._vector)->degree;
    local_110._end = (t.super_subtree_ref_base<false>._vector)->degree + local_110._begin;
    range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
    ::operator=(&local_110,t.super_subtree_ref_base<false>._size);
    local_110._v = &(t.super_subtree_ref_base<false>._vector)->ranks;
    local_110._begin =
         t.super_subtree_ref_base<false>._index * (t.super_subtree_ref_base<false>._vector)->degree;
    local_110._end = (t.super_subtree_ref_base<false>._vector)->degree + local_110._begin;
    range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
    ::operator=(&local_110,t.super_subtree_ref_base<false>._rank);
    local_110._v = &(t.super_subtree_ref_base<false>._vector)->pointers;
    local_110._begin =
         ((t.super_subtree_ref_base<false>._vector)->degree + 1) *
         t.super_subtree_ref_base<false>._index;
    local_110._end = local_110._begin + (t.super_subtree_ref_base<false>._vector)->degree + 1;
    range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
    ::operator=(&local_110,0);
    local_110._v = &(t.super_subtree_ref_base<false>._vector)->pointers;
    local_110._begin =
         ((t.super_subtree_ref_base<false>._vector)->degree + 1) *
         t.super_subtree_ref_base<false>._index;
    item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
    ::operator=((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                 *)&local_110,old_root.super_subtree_ref_base<false>._index);
    sVar4 = this->height + 1;
    this->height = sVar4;
    old_root.super_subtree_ref_base<false>._size = this->size;
    old_root.super_subtree_ref_base<false>._rank = this->rank;
    sVar8 = 0;
    pbVar7 = this;
  }
  else {
    if (t.super_subtree_ref_base<false>._height == 0) {
      auVar2 = vpmovsxbq_avx(ZEXT216(0x101));
      auVar1 = vpinsrq_avx(auVar2,(ulong)bit,1);
      auVar2._0_8_ = this->size;
      auVar2._8_8_ = this->rank;
      auVar2 = vpaddq_avx(auVar1,auVar2);
      this->size = auVar2._0_8_;
      this->rank = auVar2._8_8_;
      this_00 = subtree_ref_base<false>::leaf(&t.super_subtree_ref_base<false>);
      bitview<bv::internal::bitarray_t<4096UL>::array>::insert(this_00,index,bit);
      return;
    }
    pVar6 = subtree_ref_base<false>::find_insert_point(&t.super_subtree_ref_base<false>,index);
    subtree_ref_base<false>::child
              (&old_root.super_subtree_ref_base<false>,&t.super_subtree_ref_base<false>,pVar6.first)
    ;
    bVar3 = subtree_ref_base<false>::is_full(&old_root.super_subtree_ref_base<false>);
    if (bVar3) {
      t_00._index = t.super_subtree_ref_base<false>._index;
      t_00._vector = t.super_subtree_ref_base<false>._vector;
      t_00._height = t.super_subtree_ref_base<false>._height;
      t_00._size = t.super_subtree_ref_base<false>._size;
      t_00._rank = t.super_subtree_ref_base<false>._rank;
      find_adjacent_children
                ((tuple<unsigned_long,_unsigned_long,_unsigned_long> *)&old_root,this,t_00,
                 pVar6.first);
      local_110._v = (packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
                      *)&count;
      local_110._begin = (size_t)&end;
      local_110._end = (size_t)&begin;
      std::tuple<unsigned_long&,unsigned_long&,unsigned_long&>::operator=
                ((tuple<unsigned_long&,unsigned_long&,unsigned_long&> *)&local_110,
                 (tuple<unsigned_long,_unsigned_long,_unsigned_long> *)&old_root);
      sVar4 = end;
      sVar8 = this->buffer;
      lVar5 = 0x1000 - sVar8;
      if (t.super_subtree_ref_base<false>._height != 1) {
        lVar5 = sVar8 + 1;
      }
      if (lVar5 * sVar8 <= count) {
        end = end + 1;
        subtree_ref::insert_child((subtree_ref *)&t.super_subtree_ref_base<false>,sVar4);
      }
      t_01.super_subtree_ref_base<false>._index = t.super_subtree_ref_base<false>._index;
      t_01.super_subtree_ref_base<false>._vector = t.super_subtree_ref_base<false>._vector;
      t_01.super_subtree_ref_base<false>._height = t.super_subtree_ref_base<false>._height;
      t_01.super_subtree_ref_base<false>._size = t.super_subtree_ref_base<false>._size;
      t_01.super_subtree_ref_base<false>._rank = t.super_subtree_ref_base<false>._rank;
      redistribute(this,t_01,begin,end,count);
      pVar6 = subtree_ref_base<false>::find_insert_point(&t.super_subtree_ref_base<false>,index);
    }
    local_138 = pVar6.second;
    k = pVar6.first;
    subtree_ref_base<false>::child
              (&old_root.super_subtree_ref_base<false>,&t.super_subtree_ref_base<false>,k);
    sVar4 = old_root.super_subtree_ref_base<false>._height;
    sVar8 = old_root.super_subtree_ref_base<false>._index;
    local_128 = old_root.super_subtree_ref_base<false>._vector;
    lVar5 = (t.super_subtree_ref_base<false>._vector)->degree *
            t.super_subtree_ref_base<false>._index;
    old_root.super_subtree_ref_base<false>._index = lVar5 + k;
    old_root.super_subtree_ref_base<false>._height = lVar5 + this->degree;
    old_root.super_subtree_ref_base<false>._vector =
         (bt_impl_t *)&(t.super_subtree_ref_base<false>._vector)->sizes;
    range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096ul,(bv::allocation_policy_t)0>::data_container>>
    ::operator+=((range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096ul,(bv::allocation_policy_t)0>::data_container>>
                  *)&old_root,1);
    old_root.super_subtree_ref_base<false>._vector =
         (bt_impl_t *)&(t.super_subtree_ref_base<false>._vector)->ranks;
    lVar5 = (t.super_subtree_ref_base<false>._vector)->degree *
            t.super_subtree_ref_base<false>._index;
    old_root.super_subtree_ref_base<false>._index = k + lVar5;
    old_root.super_subtree_ref_base<false>._height = lVar5 + this->degree;
    range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096ul,(bv::allocation_policy_t)0>::data_container>>
    ::operator+=((range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096ul,(bv::allocation_policy_t)0>::data_container>>
                  *)&old_root,(ulong)bit);
    index = local_138;
    pbVar7 = local_128;
  }
  t_02.super_subtree_ref_base<false>._index = sVar8;
  t_02.super_subtree_ref_base<false>._vector = pbVar7;
  t_02.super_subtree_ref_base<false>._height = sVar4;
  t_02.super_subtree_ref_base<false>._size = old_root.super_subtree_ref_base<false>._size;
  t_02.super_subtree_ref_base<false>._rank = old_root.super_subtree_ref_base<false>._rank;
  insert(this,t_02,index,bit);
  return;
}

Assistant:

void bt_impl<W, AP>::insert(subtree_ref t, size_t index, bool bit)
        {
            assert(index <= t.size() && "Index out of bounds");
            assert(size < capacity);
            
            // If we see a full node in this point it must be the root,
            // otherwise we've violated our invariants.
            // So, since it's a root and it's full, we prepare the split
            // by allocating a new node and swapping it with the old root,
            // thus ensuring the root is always at index zero.
            // Then we go ahead pretending we started the insertion from the
            // new root, so we don't duplicate the node splitting code
            // below
            // In small mode this should not happen, since this means that
            // the whole bitvector is full and we can't insert anything at all.
            if(t.is_full())
            {
                assert(t.is_root());
                assert(!small());
                
                // Copy the old root into another node
                subtree_ref old_root = t.copy();
                
                // Empty the root and make it point to the old one
                t.sizes() = t.size();
                t.ranks() = t.rank();
                t.pointers() = 0;
                t.pointers(0) = old_root.index();
                
                // The only point in the algorithm were the height increases
                ++height;
                
                assert(root().nchildren() == 1);
                assert(root().child(0).is_full());
                
                // Pretend we were inserting from the new root
                return insert(root(), index, bit);
            }
            
            // Hereafter we assume the node is not full
            
            // If we're inserting into a leaf, it's very simple.
            if(t.is_leaf())
            {
                // 1 - Update the counters
                size += 1;
                rank += bit;
                
                // 2 - Insert the bit
                return t.leaf().insert(index, bit);
            }
            
            // Else, we are in an internal node

            // 1 - Find where we have to insert this bit
            size_t child, new_index;
            tie(child, new_index) = t.find_insert_point(index);
            
            // 2 - Check if we need a split and/or a redistribution of bits
            if(t.child(child).is_full())
            {
                // 2.1 - Find the range of children that will be the target
                //       of the redistribution
                size_t begin, end, count;
                tie(begin, end, count) = find_adjacent_children(t, child);
                
                // 2.2 - Check if we need to split or only to redistribute
                if(count >= split_limit(t))
                    t.insert_child(end++);
                
                // 2.3 - Redistribute
                redistribute(t, begin, end, count);
                
                // 2.4 - Search again where to insert the bit
                tie(child, new_index) = t.find_insert_point(index);
            }
            
            // 3 - Get the ref to the child into which we're going to recurse,
            //     Note that we need to get the ref before incrementing the
            //     counters in the parent, for consistency
            subtree_ref child_ref = t.child(child);
            
            // 4 - Update counters
            t.sizes(child, degree) += 1;
            t.ranks(child, degree) += bit;
            
            // 5 - Insert recursively
            return insert(child_ref, new_index, bit);
        }